

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCtab * lib_create_table(lua_State *L,char *libname,int hsize)

{
  TValue *pTVar1;
  char *pcVar2;
  long in_RSI;
  lua_State *in_RDI;
  undefined8 in_stack_ffffffffffffff90;
  int szhint;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int idx;
  lua_State *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  
  szhint = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (in_RSI == 0) {
    lua_createtable((lua_State *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar3
                    ,(int)in_stack_ffffffffffffffa0);
  }
  else {
    luaL_findtable((lua_State *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar3,
                   in_stack_ffffffffffffff98,szhint);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    lua_getfield(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 in_stack_ffffffffffffffb0);
    idx = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    if (*(int *)((long)in_RDI->top + -4) != -0xc) {
      in_RDI->top = in_RDI->top + -1;
      pcVar2 = luaL_findtable((lua_State *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar3,
                              in_stack_ffffffffffffff98,szhint);
      if (pcVar2 != (char *)0x0) {
        lj_err_callerv(in_RDI,LJ_ERR_BADMODN,in_RSI);
      }
      pTVar1 = in_RDI->top;
      (pTVar1->field_2).field_0 = in_RDI->top[-1].field_2.field_0;
      (pTVar1->field_2).it = 0xfffffff4;
      in_RDI->top = in_RDI->top + 1;
      lua_setfield(in_stack_ffffffffffffffb8,idx,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    in_RDI->top = in_RDI->top + -1;
    pTVar1 = in_RDI->top;
    pTVar1[-1].field_2.field_0 = (in_RDI->top->field_2).field_0;
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffff4;
  }
  return (GCtab *)(ulong)in_RDI->top[-1].u32.lo;
}

Assistant:

static GCtab *lib_create_table(lua_State *L, const char *libname, int hsize)
{
  if (libname) {
    luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
    lua_getfield(L, -1, libname);
    if (!tvistab(L->top-1)) {
      L->top--;
      if (luaL_findtable(L, LUA_GLOBALSINDEX, libname, hsize) != NULL)
	lj_err_callerv(L, LJ_ERR_BADMODN, libname);
      settabV(L, L->top, tabV(L->top-1));
      L->top++;
      lua_setfield(L, -3, libname);  /* _LOADED[libname] = new table */
    }
    L->top--;
    settabV(L, L->top-1, tabV(L->top));
  } else {
    lua_createtable(L, 0, hsize);
  }
  return tabV(L->top-1);
}